

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testCreateHeartbeat(int count)

{
  long lVar1;
  Heartbeat local_178;
  int local_1c;
  long lStack_18;
  int i;
  long start;
  int count_local;
  
  start._4_4_ = count + -1;
  lStack_18 = GetTickCount();
  for (local_1c = 0; local_1c <= start._4_4_; local_1c = local_1c + 1) {
    FIX42::Heartbeat::Heartbeat(&local_178);
    FIX42::Heartbeat::~Heartbeat(&local_178);
  }
  lVar1 = GetTickCount();
  return lVar1 - lStack_18;
}

Assistant:

long testCreateHeartbeat(int count) {
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX42::Heartbeat();
  }

  return GetTickCount() - start;
}